

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::RALocalAllocator::allocJumpTable
          (RALocalAllocator *this,InstNode *node,RABlocks *targets,RABlock *cont)

{
  RABlock *block;
  Error EVar1;
  RABlock **ppRVar2;
  RASharedAssignment *pRVar3;
  RASharedAssignment *pRVar4;
  
  EVar1 = 3;
  if (*(int *)(targets + 8) != 0) {
    (this->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
    ppRVar2 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](targets,0);
    block = *ppRVar2;
    if ((ulong)*(uint *)(block + 0xb8) != 0xffffffff) {
      pRVar3 = ZoneVector<asmjit::v1_14::RASharedAssignment>::operator[]
                         (&this->_pass->_sharedAssignments,(ulong)*(uint *)(block + 0xb8));
      EVar1 = allocInst(this,node);
      if ((EVar1 == 0) &&
         ((pRVar3->_physToWorkMap == (PhysToWorkMap *)0x0 ||
          (EVar1 = switchToAssignment(this,pRVar3->_physToWorkMap,&pRVar3->_liveIn,true,false),
          EVar1 == 0)))) {
        if ((ulong)*(uint *)(block + 0xb8) == 0xffffffff) {
          pRVar4 = (RASharedAssignment *)(block + 0xbc);
        }
        else {
          pRVar4 = ZoneVector<asmjit::v1_14::RASharedAssignment>::operator[]
                             ((ZoneVector<asmjit::v1_14::RASharedAssignment> *)
                              (*(long *)block + 0xe8),(ulong)*(uint *)(block + 0xb8));
        }
        EVar1 = spillScratchGpRegsBeforeEntry(this,pRVar4->_entryScratchGpRegs);
        if ((EVar1 == 0) &&
           ((pRVar3->_physToWorkMap != (PhysToWorkMap *)0x0 ||
            (EVar1 = BaseRAPass::setBlockEntryAssignment
                               (this->_pass,block,this->_block,&this->_curAssignment), EVar1 == 0)))
           ) {
          EVar1 = 0;
        }
      }
    }
  }
  return EVar1;
}

Assistant:

Error RALocalAllocator::allocJumpTable(InstNode* node, const RABlocks& targets, RABlock* cont) noexcept {
  // TODO: Do we really need to use `cont`?
  DebugUtils::unused(cont);

  if (targets.empty())
    return DebugUtils::errored(kErrorInvalidState);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // All `targets` should have the same sharedAssignmentId, we just read the first.
  RABlock* anyTarget = targets[0];
  if (!anyTarget->hasSharedAssignmentId())
    return DebugUtils::errored(kErrorInvalidState);

  RASharedAssignment& sharedAssignment = _pass->_sharedAssignments[anyTarget->sharedAssignmentId()];

  ASMJIT_PROPAGATE(allocInst(node));

  if (!sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(switchToAssignment(
      sharedAssignment.physToWorkMap(),
      sharedAssignment.liveIn(),
      true,  // Read-only.
      false  // Try-mode.
    ));
  }

  ASMJIT_PROPAGATE(spillRegsBeforeEntry(anyTarget));

  if (sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(anyTarget, block(), _curAssignment));
  }

  return kErrorOk;
}